

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cMultiBindTests.cpp
# Opt level: O0

IterateResult __thiscall
gl4cts::MultiBind::ErrorsBindBuffersTest::iterate(ErrorsBindBuffersTest *this)

{
  char cVar1;
  deUint32 dVar2;
  RenderContext *pRVar3;
  undefined4 extraout_var;
  TestContext *pTVar4;
  TestLog *pTVar5;
  MessageBuilder *pMVar6;
  TestError *pTVar7;
  Enum<int,_2UL> EVar8;
  Buffer *local_1a78;
  Buffer *local_1588;
  Enum<int,_2UL> local_1438;
  GetNameFunc local_1428;
  int local_1420;
  Enum<int,_2UL> local_1418;
  int local_1404;
  MessageBuilder local_1400;
  int local_127c;
  GetNameFunc p_Stack_1278;
  GLenum generated_error_9;
  int local_1270;
  Enum<int,_2UL> local_1268;
  GetNameFunc local_1258;
  int local_1250;
  Enum<int,_2UL> local_1248;
  int local_1234;
  MessageBuilder local_1230;
  int local_10ac;
  undefined4 uStack_10a8;
  GLenum generated_error_8;
  GLintptr t_sizes_1 [4];
  GLintptr t_offsets_1 [4];
  Enum<int,_2UL> local_1058;
  GetNameFunc local_1048;
  int local_1040;
  Enum<int,_2UL> local_1038;
  int local_1024;
  MessageBuilder local_1020;
  int local_e9c;
  GetNameFunc p_Stack_e98;
  GLenum generated_error_7;
  int local_e90;
  Enum<int,_2UL> local_e88;
  GetNameFunc local_e78;
  int local_e70;
  Enum<int,_2UL> local_e68;
  int local_e54;
  MessageBuilder local_e50;
  int local_ccc;
  undefined4 uStack_cc8;
  GLenum generated_error_6;
  GLintptr t_sizes [4];
  GLintptr t_offsets [4];
  Enum<int,_2UL> local_c78;
  GetNameFunc local_c68;
  int local_c60;
  Enum<int,_2UL> local_c58;
  int local_c44;
  MessageBuilder local_c40;
  int local_abc;
  GetNameFunc p_Stack_ab8;
  GLenum generated_error_5;
  int local_ab0;
  Enum<int,_2UL> local_aa8;
  GetNameFunc local_a98;
  int local_a90;
  Enum<int,_2UL> local_a88;
  int local_a74;
  MessageBuilder local_a70;
  int local_8ec;
  GLintptr GStack_8e8;
  GLenum generated_error_4;
  GLuint t_buffer_ids [4];
  Enum<int,_2UL> local_8c8;
  GetNameFunc local_8b8;
  int local_8b0;
  Enum<int,_2UL> local_8a8;
  int local_894;
  MessageBuilder local_890;
  int local_70c;
  GetNameFunc p_Stack_708;
  GLenum generated_error_3;
  int local_700;
  Enum<int,_2UL> local_6f8;
  GetNameFunc local_6e8;
  int local_6e0;
  Enum<int,_2UL> local_6d8;
  int local_6c4;
  MessageBuilder local_6c0;
  int local_53c;
  int local_538;
  GLenum generated_error_2;
  GLuint t_first;
  GLsizei t_count;
  size_t j;
  GLintptr sizes [4];
  GLintptr offsets [4];
  GLuint buffer_ids [4];
  Buffer buffer_1 [4];
  long local_470;
  size_t validated_index;
  GLintptr size_1;
  GLint max_buffers;
  GLint offset_alignment;
  GLintptr offset_1;
  undefined4 local_448;
  GLuint invalid_id;
  GLuint first_1;
  GLsizei count_1;
  GLintptr buffer_size_1;
  int local_430;
  GetNameFunc local_428;
  int local_420;
  string local_418;
  string *local_3f8;
  string *target_name;
  undefined4 local_3e8;
  GLenum target;
  GLenum pname_max;
  GLenum pname_alignment;
  size_t i;
  int local_3d0;
  Enum<int,_2UL> local_3c8;
  GetNameFunc local_3b8;
  int local_3b0;
  Enum<int,_2UL> local_3a8;
  int local_394;
  MessageBuilder local_390;
  int local_20c;
  GetNameFunc p_Stack_208;
  GLenum generated_error_1;
  int local_200;
  Enum<int,_2UL> local_1f8;
  GetNameFunc local_1e8;
  int local_1e0;
  Enum<int,_2UL> local_1d8;
  int local_1c4;
  MessageBuilder local_1c0;
  int local_40;
  GLenum generated_error;
  undefined1 local_30 [8];
  Buffer buffer;
  Functions *gl;
  ErrorsBindBuffersTest *this_local;
  
  pRVar3 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  buffer.m_target = (*pRVar3->_vptr_RenderContext[3])();
  buffer._20_4_ = extraout_var;
  MultiBind::Buffer::Buffer((Buffer *)local_30);
  MultiBind::Buffer::InitData
            ((Buffer *)local_30,(this->super_TestCase).m_context,0x8892,0x88ea,0x10,(GLvoid *)0x0);
  (**(code **)(buffer._16_8_ + 0x58))(0x8892,0,1,local_30);
  local_40 = (**(code **)(buffer._16_8_ + 0x800))();
  if (local_40 != 0x500) {
    pTVar4 = deqp::Context::getTestContext((this->super_TestCase).m_context);
    pTVar5 = tcu::TestContext::getLog(pTVar4);
    tcu::TestLog::operator<<(&local_1c0,pTVar5,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar6 = tcu::MessageBuilder::operator<<(&local_1c0,(char (*) [7])0x2a372b5);
    pMVar6 = tcu::MessageBuilder::operator<<
                       (pMVar6,(char (*) [128])
                               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cMultiBindTests.cpp"
                       );
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [9])", line: ");
    local_1c4 = 0x66c;
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&local_1c4);
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [20])". Got wrong error: ");
    EVar8 = glu::getErrorStr(local_40);
    local_1e8 = EVar8.m_getName;
    local_1e0 = EVar8.m_value;
    local_1d8.m_getName = local_1e8;
    local_1d8.m_value = local_1e0;
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&local_1d8);
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [13])0x2a22899);
    EVar8 = glu::getErrorStr(0x500);
    p_Stack_208 = EVar8.m_getName;
    local_200 = EVar8.m_value;
    local_1f8.m_getName = p_Stack_208;
    local_1f8.m_value = local_200;
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&local_1f8);
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [12])", message: ");
    pMVar6 = tcu::MessageBuilder::operator<<
                       (pMVar6,(char (*) [38])"BindBuffersBase with invalid <target>");
    tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_1c0);
    pTVar7 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar7,"Invalid error generated",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cMultiBindTests.cpp"
               ,0x66c);
    __cxa_throw(pTVar7,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  (**(code **)(buffer._16_8_ + 0x60))(0x8892,0,1,local_30,&iterate::offset,&iterate::size);
  local_20c = (**(code **)(buffer._16_8_ + 0x800))();
  if (local_20c != 0x500) {
    pTVar4 = deqp::Context::getTestContext((this->super_TestCase).m_context);
    pTVar5 = tcu::TestContext::getLog(pTVar4);
    tcu::TestLog::operator<<(&local_390,pTVar5,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar6 = tcu::MessageBuilder::operator<<(&local_390,(char (*) [7])0x2a372b5);
    pMVar6 = tcu::MessageBuilder::operator<<
                       (pMVar6,(char (*) [128])
                               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cMultiBindTests.cpp"
                       );
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [9])", line: ");
    local_394 = 0x66f;
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&local_394);
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [20])". Got wrong error: ");
    EVar8 = glu::getErrorStr(local_20c);
    local_3b8 = EVar8.m_getName;
    local_3b0 = EVar8.m_value;
    local_3a8.m_getName = local_3b8;
    local_3a8.m_value = local_3b0;
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&local_3a8);
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [13])0x2a22899);
    EVar8 = glu::getErrorStr(0x500);
    i = (size_t)EVar8.m_getName;
    local_3d0 = EVar8.m_value;
    local_3c8.m_getName = (GetNameFunc)i;
    local_3c8.m_value = local_3d0;
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&local_3c8);
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [12])", message: ");
    pMVar6 = tcu::MessageBuilder::operator<<
                       (pMVar6,(char (*) [39])"BindBuffersRange with invalid <target>");
    tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_390);
    pTVar7 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar7,"Invalid error generated",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cMultiBindTests.cpp"
               ,0x66f);
    __cxa_throw(pTVar7,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  MultiBind::Buffer::~Buffer((Buffer *)local_30);
  _pname_max = 0;
  while( true ) {
    if (3 < _pname_max) {
      pTVar4 = deqp::Context::getTestContext((this->super_TestCase).m_context);
      tcu::TestContext::setTestResult(pTVar4,QP_TEST_RESULT_PASS,"Pass");
      return STOP;
    }
    target = *(GLenum *)(s_buffer_infos + _pname_max * 0x14 + 4);
    local_3e8 = *(undefined4 *)(s_buffer_infos + _pname_max * 0x14 + 0xc);
    target_name._4_4_ = *(GLenum *)(s_buffer_infos + _pname_max * 0x14);
    EVar8 = glu::getBufferTargetStr(target_name._4_4_);
    buffer_size_1 = (GLintptr)EVar8.m_getName;
    local_430 = EVar8.m_value;
    local_428 = (GetNameFunc)buffer_size_1;
    local_420 = local_430;
    tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_418,&local_428);
    local_3f8 = &local_418;
    _first_1 = 0x10;
    invalid_id = 4;
    local_448 = 0;
    offset_1._4_4_ = 1;
    _max_buffers = 4;
    size_1._4_4_ = 1;
    size_1._0_4_ = 0;
    validated_index = 0xc;
    local_470 = 3;
    if (target != 0) {
      (**(code **)(buffer._16_8_ + 0x868))(target,(long)&size_1 + 4);
      dVar2 = (**(code **)(buffer._16_8_ + 0x800))();
      glu::checkError(dVar2,"GetIntegerv",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cMultiBindTests.cpp"
                      ,0x689);
      _first_1 = size_1._4_4_ + _first_1;
      _max_buffers = (long)size_1._4_4_;
      validated_index = _first_1 - _max_buffers;
    }
    (**(code **)(buffer._16_8_ + 0x868))(local_3e8,&size_1);
    dVar2 = (**(code **)(buffer._16_8_ + 0x800))();
    glu::checkError(dVar2,"GetIntegerv",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cMultiBindTests.cpp"
                    ,0x692);
    if ((int)(GLuint)size_1 < 4) {
      invalid_id = (GLuint)size_1;
      local_470 = (long)(int)((GLuint)size_1 - 1);
    }
    local_1588 = (Buffer *)(buffer_ids + 2);
    do {
      MultiBind::Buffer::Buffer(local_1588);
      local_1588 = local_1588 + 1;
    } while (local_1588 != (Buffer *)&buffer_1[3].m_target);
    for (_t_first = 0; _t_first < 4; _t_first = _t_first + 1) {
      MultiBind::Buffer::InitData
                ((Buffer *)&buffer_1[_t_first - 1].m_target,(this->super_TestCase).m_context,
                 target_name._4_4_,0x88ea,_first_1,(GLvoid *)0x0);
      buffer_ids[_t_first - 2] = buffer_1[_t_first - 1].m_target;
      sizes[_t_first + 3] = _max_buffers;
      sizes[_t_first - 1] = validated_index;
    }
    generated_error_2 = 4;
    local_538 = 0;
    if ((int)(GLuint)size_1 < 4) {
      generated_error_2 = (GLuint)size_1 + 1;
    }
    else {
      local_538 = (GLuint)size_1 - 3;
    }
    (**(code **)(buffer._16_8_ + 0x58))(target_name._4_4_,local_538,generated_error_2,offsets + 3);
    local_53c = (**(code **)(buffer._16_8_ + 0x800))();
    if (local_53c != 0x502) {
      pTVar4 = deqp::Context::getTestContext((this->super_TestCase).m_context);
      pTVar5 = tcu::TestContext::getLog(pTVar4);
      tcu::TestLog::operator<<(&local_6c0,pTVar5,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar6 = tcu::MessageBuilder::operator<<(&local_6c0,(char (*) [7])0x2a372b5);
      pMVar6 = tcu::MessageBuilder::operator<<
                         (pMVar6,(char (*) [128])
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cMultiBindTests.cpp"
                         );
      pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [9])", line: ");
      local_6c4 = 0x6c0;
      pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&local_6c4);
      pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [20])". Got wrong error: ");
      EVar8 = glu::getErrorStr(local_53c);
      local_6e8 = EVar8.m_getName;
      local_6e0 = EVar8.m_value;
      local_6d8.m_getName = local_6e8;
      local_6d8.m_value = local_6e0;
      pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&local_6d8);
      pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [13])0x2a22899);
      EVar8 = glu::getErrorStr(0x502);
      p_Stack_708 = EVar8.m_getName;
      local_700 = EVar8.m_value;
      local_6f8.m_getName = p_Stack_708;
      local_6f8.m_value = local_700;
      pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&local_6f8);
      pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [12])", message: ");
      pMVar6 = tcu::MessageBuilder::operator<<
                         (pMVar6,(char (*) [57])
                                 "BindBuffersBase with invalid <first> + <count>, target: ");
      pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,local_3f8);
      tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_6c0);
      pTVar7 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar7,"Invalid error generated",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cMultiBindTests.cpp"
                 ,0x6c0);
      __cxa_throw(pTVar7,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
    (**(code **)(buffer._16_8_ + 0x60))
              (target_name._4_4_,local_538,generated_error_2,offsets + 3,sizes + 3,&j);
    local_70c = (**(code **)(buffer._16_8_ + 0x800))();
    if (local_70c != 0x502) {
      pTVar4 = deqp::Context::getTestContext((this->super_TestCase).m_context);
      pTVar5 = tcu::TestContext::getLog(pTVar4);
      tcu::TestLog::operator<<(&local_890,pTVar5,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar6 = tcu::MessageBuilder::operator<<(&local_890,(char (*) [7])0x2a372b5);
      pMVar6 = tcu::MessageBuilder::operator<<
                         (pMVar6,(char (*) [128])
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cMultiBindTests.cpp"
                         );
      pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [9])", line: ");
      local_894 = 0x6c4;
      pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&local_894);
      pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [20])". Got wrong error: ");
      EVar8 = glu::getErrorStr(local_70c);
      local_8b8 = EVar8.m_getName;
      local_8b0 = EVar8.m_value;
      local_8a8.m_getName = local_8b8;
      local_8a8.m_value = local_8b0;
      pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&local_8a8);
      pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [13])0x2a22899);
      EVar8 = glu::getErrorStr(0x502);
      t_buffer_ids._8_8_ = EVar8.m_getName;
      local_8c8.m_value = EVar8.m_value;
      local_8c8.m_getName = (GetNameFunc)t_buffer_ids._8_8_;
      pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&local_8c8);
      pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [12])", message: ");
      pMVar6 = tcu::MessageBuilder::operator<<
                         (pMVar6,(char (*) [58])
                                 "BindBuffersRange with invalid <first> + <count>, target: ");
      pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,local_3f8);
      tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_890);
      pTVar7 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar7,"Invalid error generated",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cMultiBindTests.cpp"
                 ,0x6c4);
      __cxa_throw(pTVar7,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
    GStack_8e8 = offsets[3];
    t_buffer_ids[0] = buffer_ids[0];
    t_buffer_ids[1] = buffer_ids[1];
    local_70c = 0x502;
    while( true ) {
      cVar1 = (**(code **)(buffer._16_8_ + 0xc68))(offset_1._4_4_);
      if (cVar1 != '\x01') break;
      offset_1._4_4_ = offset_1._4_4_ + 1;
    }
    *(int *)((long)&stack0xfffffffffffff718 + local_470 * 4) = offset_1._4_4_;
    (**(code **)(buffer._16_8_ + 0x58))
              (target_name._4_4_,local_448,invalid_id,&stack0xfffffffffffff718);
    local_8ec = (**(code **)(buffer._16_8_ + 0x800))();
    if (local_8ec != 0x502) {
      pTVar4 = deqp::Context::getTestContext((this->super_TestCase).m_context);
      pTVar5 = tcu::TestContext::getLog(pTVar4);
      tcu::TestLog::operator<<(&local_a70,pTVar5,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar6 = tcu::MessageBuilder::operator<<(&local_a70,(char (*) [7])0x2a372b5);
      pMVar6 = tcu::MessageBuilder::operator<<
                         (pMVar6,(char (*) [128])
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cMultiBindTests.cpp"
                         );
      pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [9])", line: ");
      local_a74 = 0x6df;
      pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&local_a74);
      pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [20])". Got wrong error: ");
      EVar8 = glu::getErrorStr(local_8ec);
      local_a98 = EVar8.m_getName;
      local_a90 = EVar8.m_value;
      local_a88.m_getName = local_a98;
      local_a88.m_value = local_a90;
      pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&local_a88);
      pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [13])0x2a22899);
      EVar8 = glu::getErrorStr(0x502);
      p_Stack_ab8 = EVar8.m_getName;
      local_ab0 = EVar8.m_value;
      local_aa8.m_getName = p_Stack_ab8;
      local_aa8.m_value = local_ab0;
      pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&local_aa8);
      pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [12])", message: ");
      pMVar6 = tcu::MessageBuilder::operator<<
                         (pMVar6,(char (*) [49])"BindBuffersBase with invalid buffer id, target: ");
      pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,local_3f8);
      tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_a70);
      pTVar7 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar7,"Invalid error generated",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cMultiBindTests.cpp"
                 ,0x6df);
      __cxa_throw(pTVar7,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
    (**(code **)(buffer._16_8_ + 0x60))
              (target_name._4_4_,local_448,invalid_id,&stack0xfffffffffffff718,sizes + 3,&j);
    local_abc = (**(code **)(buffer._16_8_ + 0x800))();
    if (local_abc != 0x502) {
      pTVar4 = deqp::Context::getTestContext((this->super_TestCase).m_context);
      pTVar5 = tcu::TestContext::getLog(pTVar4);
      tcu::TestLog::operator<<(&local_c40,pTVar5,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar6 = tcu::MessageBuilder::operator<<(&local_c40,(char (*) [7])0x2a372b5);
      pMVar6 = tcu::MessageBuilder::operator<<
                         (pMVar6,(char (*) [128])
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cMultiBindTests.cpp"
                         );
      pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [9])", line: ");
      local_c44 = 0x6e2;
      pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&local_c44);
      pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [20])". Got wrong error: ");
      EVar8 = glu::getErrorStr(local_abc);
      local_c68 = EVar8.m_getName;
      local_c60 = EVar8.m_value;
      local_c58.m_getName = local_c68;
      local_c58.m_value = local_c60;
      pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&local_c58);
      pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [13])0x2a22899);
      EVar8 = glu::getErrorStr(0x502);
      local_c78.m_getName = EVar8.m_getName;
      local_c78.m_value = EVar8.m_value;
      pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&local_c78);
      pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [12])", message: ");
      pMVar6 = tcu::MessageBuilder::operator<<
                         (pMVar6,(char (*) [50])"BindBuffersRange with invalid buffer id, target: ")
      ;
      pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,local_3f8);
      tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_c40);
      pTVar7 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar7,"Invalid error generated",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cMultiBindTests.cpp"
                 ,0x6e2);
      __cxa_throw(pTVar7,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
    t_sizes[3] = sizes[3];
    t_sizes[1]._0_4_ = (undefined4)sizes[1];
    t_sizes[1]._4_4_ = sizes[1]._4_4_;
    t_sizes[2]._0_4_ = (undefined4)sizes[2];
    t_sizes[2]._4_4_ = sizes[2]._4_4_;
    uStack_cc8 = (undefined4)j;
    generated_error_6 = j._4_4_;
    t_sizes[0]._0_4_ = (undefined4)sizes[0];
    t_sizes[0]._4_4_ = sizes[0]._4_4_;
    t_sizes[local_470 + 3] = -1;
    *(undefined8 *)((long)&stack0xfffffffffffff338 + local_470 * 8) = 0xffffffffffffffff;
    (**(code **)(buffer._16_8_ + 0x60))
              (target_name._4_4_,local_448,invalid_id,offsets + 3,t_sizes + 3,&j);
    local_ccc = (**(code **)(buffer._16_8_ + 0x800))();
    if (local_ccc != 0x501) {
      pTVar4 = deqp::Context::getTestContext((this->super_TestCase).m_context);
      pTVar5 = tcu::TestContext::getLog(pTVar4);
      tcu::TestLog::operator<<(&local_e50,pTVar5,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar6 = tcu::MessageBuilder::operator<<(&local_e50,(char (*) [7])0x2a372b5);
      pMVar6 = tcu::MessageBuilder::operator<<
                         (pMVar6,(char (*) [128])
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cMultiBindTests.cpp"
                         );
      pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [9])", line: ");
      local_e54 = 0x6f3;
      pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&local_e54);
      pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [20])". Got wrong error: ");
      EVar8 = glu::getErrorStr(local_ccc);
      local_e78 = EVar8.m_getName;
      local_e70 = EVar8.m_value;
      local_e68.m_getName = local_e78;
      local_e68.m_value = local_e70;
      pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&local_e68);
      pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [13])0x2a22899);
      EVar8 = glu::getErrorStr(0x501);
      p_Stack_e98 = EVar8.m_getName;
      local_e90 = EVar8.m_value;
      local_e88.m_getName = p_Stack_e98;
      local_e88.m_value = local_e90;
      pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&local_e88);
      pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [12])", message: ");
      pMVar6 = tcu::MessageBuilder::operator<<
                         (pMVar6,(char (*) [48])"BindBuffersRange with negative offset, target: ");
      pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,local_3f8);
      tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_e50);
      pTVar7 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar7,"Invalid error generated",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cMultiBindTests.cpp"
                 ,0x6f3);
      __cxa_throw(pTVar7,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
    (**(code **)(buffer._16_8_ + 0x60))
              (target_name._4_4_,local_448,invalid_id,offsets + 3,sizes + 3,&stack0xfffffffffffff338
              );
    local_e9c = (**(code **)(buffer._16_8_ + 0x800))();
    if (local_e9c != 0x501) {
      pTVar4 = deqp::Context::getTestContext((this->super_TestCase).m_context);
      pTVar5 = tcu::TestContext::getLog(pTVar4);
      tcu::TestLog::operator<<(&local_1020,pTVar5,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar6 = tcu::MessageBuilder::operator<<(&local_1020,(char (*) [7])0x2a372b5);
      pMVar6 = tcu::MessageBuilder::operator<<
                         (pMVar6,(char (*) [128])
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cMultiBindTests.cpp"
                         );
      pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [9])", line: ");
      local_1024 = 0x6f7;
      pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&local_1024);
      pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [20])". Got wrong error: ");
      EVar8 = glu::getErrorStr(local_e9c);
      local_1048 = EVar8.m_getName;
      local_1040 = EVar8.m_value;
      local_1038.m_getName = local_1048;
      local_1038.m_value = local_1040;
      pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&local_1038);
      pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [13])0x2a22899);
      EVar8 = glu::getErrorStr(0x501);
      local_1058.m_getName = EVar8.m_getName;
      local_1058.m_value = EVar8.m_value;
      pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&local_1058);
      pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [12])", message: ");
      pMVar6 = tcu::MessageBuilder::operator<<
                         (pMVar6,(char (*) [46])"BindBuffersRange with negative size, target: ");
      pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,local_3f8);
      tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_1020);
      pTVar7 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar7,"Invalid error generated",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cMultiBindTests.cpp"
                 ,0x6f7);
      __cxa_throw(pTVar7,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
    t_sizes_1[3] = sizes[3];
    t_sizes_1[1]._0_4_ = (undefined4)sizes[1];
    t_sizes_1[1]._4_4_ = sizes[1]._4_4_;
    t_sizes_1[2]._0_4_ = (undefined4)sizes[2];
    t_sizes_1[2]._4_4_ = sizes[2]._4_4_;
    uStack_10a8 = (undefined4)j;
    generated_error_8 = j._4_4_;
    t_sizes_1[0]._0_4_ = (undefined4)sizes[0];
    t_sizes_1[0]._4_4_ = sizes[0]._4_4_;
    t_sizes_1[local_470 + 3] = t_sizes_1[local_470 + 3] + -1;
    *(size_t *)((long)&stack0xffffffffffffef58 + local_470 * 8) = validated_index - 1;
    (**(code **)(buffer._16_8_ + 0x60))
              (target_name._4_4_,local_448,invalid_id,offsets + 3,t_sizes_1 + 3,&j);
    local_10ac = (**(code **)(buffer._16_8_ + 0x800))();
    if (local_10ac != 0x501) break;
    if (target_name._4_4_ == 0x8c8e) {
      (**(code **)(buffer._16_8_ + 0x60))
                (0x8c8e,local_448,invalid_id,offsets + 3,sizes + 3,&stack0xffffffffffffef58);
      local_127c = (**(code **)(buffer._16_8_ + 0x800))();
      if (local_127c != 0x501) {
        pTVar4 = deqp::Context::getTestContext((this->super_TestCase).m_context);
        pTVar5 = tcu::TestContext::getLog(pTVar4);
        tcu::TestLog::operator<<(&local_1400,pTVar5,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar6 = tcu::MessageBuilder::operator<<(&local_1400,(char (*) [7])0x2a372b5);
        pMVar6 = tcu::MessageBuilder::operator<<
                           (pMVar6,(char (*) [128])
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cMultiBindTests.cpp"
                           );
        pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [9])", line: ");
        local_1404 = 0x70e;
        pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&local_1404);
        pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [20])". Got wrong error: ");
        EVar8 = glu::getErrorStr(local_127c);
        local_1428 = EVar8.m_getName;
        local_1420 = EVar8.m_value;
        local_1418.m_getName = local_1428;
        local_1418.m_value = local_1420;
        pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&local_1418);
        pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [13])0x2a22899);
        EVar8 = glu::getErrorStr(0x501);
        local_1438.m_getName = EVar8.m_getName;
        local_1438.m_value = EVar8.m_value;
        pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&local_1438);
        pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [12])", message: ");
        pMVar6 = tcu::MessageBuilder::operator<<
                           (pMVar6,(char (*) [47])"BindBuffersRange with invalid <size>, target: ");
        pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,local_3f8);
        tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder(&local_1400);
        pTVar7 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (pTVar7,"Invalid error generated",(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cMultiBindTests.cpp"
                   ,0x70e);
        __cxa_throw(pTVar7,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
      }
      local_127c = 0x501;
    }
    local_1a78 = (Buffer *)&buffer_1[3].m_target;
    do {
      local_1a78 = local_1a78 + -1;
      MultiBind::Buffer::~Buffer(local_1a78);
    } while (local_1a78 != (Buffer *)(buffer_ids + 2));
    std::__cxx11::string::~string((string *)&local_418);
    _pname_max = _pname_max + 1;
  }
  pTVar4 = deqp::Context::getTestContext((this->super_TestCase).m_context);
  pTVar5 = tcu::TestContext::getLog(pTVar4);
  tcu::TestLog::operator<<(&local_1230,pTVar5,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar6 = tcu::MessageBuilder::operator<<(&local_1230,(char (*) [7])0x2a372b5);
  pMVar6 = tcu::MessageBuilder::operator<<
                     (pMVar6,(char (*) [128])
                             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cMultiBindTests.cpp"
                     );
  pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [9])", line: ");
  local_1234 = 0x708;
  pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&local_1234);
  pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [20])". Got wrong error: ");
  EVar8 = glu::getErrorStr(local_10ac);
  local_1258 = EVar8.m_getName;
  local_1250 = EVar8.m_value;
  local_1248.m_getName = local_1258;
  local_1248.m_value = local_1250;
  pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&local_1248);
  pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [13])0x2a22899);
  EVar8 = glu::getErrorStr(0x501);
  p_Stack_1278 = EVar8.m_getName;
  local_1270 = EVar8.m_value;
  local_1268.m_getName = p_Stack_1278;
  local_1268.m_value = local_1270;
  pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&local_1268);
  pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [12])", message: ");
  pMVar6 = tcu::MessageBuilder::operator<<
                     (pMVar6,(char (*) [49])"BindBuffersRange with invalid <offset>, target: ");
  pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,local_3f8);
  tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_1230);
  pTVar7 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (pTVar7,"Invalid error generated",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cMultiBindTests.cpp"
             ,0x708);
  __cxa_throw(pTVar7,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
}

Assistant:

tcu::TestNode::IterateResult ErrorsBindBuffersTest::iterate()
{
	const Functions& gl = m_context.getRenderContext().getFunctions();

#if DEBUG_ENBALE_MESSAGE_CALLBACK
	gl.debugMessageCallback(debug_proc, &m_context);
	GLU_EXPECT_NO_ERROR(gl.getError(), "DebugMessageCallback");
#endif /* DEBUG_ENBALE_MESSAGE_CALLBACK */

	/* - INVALID_ENUM when <target> is not valid; */
	{
		static const GLintptr buffer_size = 16;
		static const GLsizei  count		  = 1;
		static const GLuint   first		  = 0;
		static const GLintptr offset	  = 4;
		static const GLintptr size		  = buffer_size - offset;

		Buffer buffer;

		buffer.InitData(m_context, GL_ARRAY_BUFFER, GL_DYNAMIC_COPY, buffer_size, 0 /* data */);

		gl.bindBuffersBase(GL_ARRAY_BUFFER, first, count, &buffer.m_id);
		CHECK_ERROR(GL_INVALID_ENUM, "BindBuffersBase with invalid <target>");

		gl.bindBuffersRange(GL_ARRAY_BUFFER, first, count, &buffer.m_id, &offset, &size);
		CHECK_ERROR(GL_INVALID_ENUM, "BindBuffersRange with invalid <target>");
	}

	for (size_t i = 0; i < s_n_buffer_tragets; ++i)
	{
		static const GLsizei n_buffers = 4;

		const GLenum	   pname_alignment = s_buffer_infos[i].m_pname_alignment;
		const GLenum	   pname_max	   = s_buffer_infos[i].m_pname_max;
		const GLenum	   target		   = s_buffer_infos[i].m_target;
		const std::string& target_name	 = glu::getBufferTargetStr(target).toString();

		GLintptr buffer_size	  = 16;
		GLsizei  count			  = n_buffers;
		GLuint   first			  = 0;
		GLuint   invalid_id		  = 1; /* Start with 1, as 0 is not valid name */
		GLintptr offset			  = 4; /* ATOMIC and XFB require alignment of 4 */
		GLint	offset_alignment = 1;
		GLint	max_buffers	  = 0;
		GLintptr size			  = buffer_size - offset;
		size_t   validated_index  = n_buffers - 1;

		/* Get alignment */
		if (0 != pname_alignment)
		{
			gl.getIntegerv(pname_alignment, &offset_alignment);
			GLU_EXPECT_NO_ERROR(gl.getError(), "GetIntegerv");

			buffer_size += offset_alignment;
			offset = offset_alignment;
			size   = buffer_size - offset;
		}

		/* Get max */
		gl.getIntegerv(pname_max, &max_buffers);
		GLU_EXPECT_NO_ERROR(gl.getError(), "GetIntegerv");

		/* Select count so <first + count> does not exceed max.
		 * Validated index shall be in the specified range.
		 */
		if (n_buffers > max_buffers)
		{
			count			= max_buffers;
			validated_index = max_buffers - 1;
		}

		/* Storage */
		Buffer   buffer[n_buffers];
		GLuint   buffer_ids[n_buffers];
		GLintptr offsets[n_buffers];
		GLintptr sizes[n_buffers];

		/* Prepare buffers */
		for (size_t j = 0; j < n_buffers; ++j)
		{
			buffer[j].InitData(m_context, target, GL_DYNAMIC_COPY, buffer_size, 0 /* data */);

			buffer_ids[j] = buffer[j].m_id;
			offsets[j]	= offset;
			sizes[j]	  = size;
		}

		/* - INVALID_OPERATION when <first> + <count> is greater than allowed limit; */
		{
			GLsizei t_count = n_buffers;
			GLuint  t_first = 0;

			/* Select first so <first + count> exceeds max, avoid negative first */
			if (n_buffers <= max_buffers)
			{
				t_first = max_buffers - n_buffers + 1;
			}
			else
			{
				t_count = max_buffers + 1;
				/* first = 0; */
			}

			/* Test */
			gl.bindBuffersBase(target, t_first, t_count, buffer_ids);
			CHECK_ERROR(GL_INVALID_OPERATION,
						"BindBuffersBase with invalid <first> + <count>, target: " << target_name);

			gl.bindBuffersRange(target, t_first, t_count, buffer_ids, offsets, sizes);
			CHECK_ERROR(GL_INVALID_OPERATION,
						"BindBuffersRange with invalid <first> + <count>, target: " << target_name);
		}

		/* - INVALID_OPERATION if any value in <buffers> is not zero or the name of
		 * existing buffer;
		 */
		{
			GLuint t_buffer_ids[n_buffers];

			memcpy(t_buffer_ids, buffer_ids, sizeof(buffer_ids));

			/* Find invalid id */
			while (1)
			{
				if (GL_TRUE != gl.isBuffer(invalid_id))
				{
					break;
				}

				invalid_id += 1;
			}

			/* Invalidate the entry */
			t_buffer_ids[validated_index] = invalid_id;

			/* Test */
			gl.bindBuffersBase(target, first, count, t_buffer_ids);
			CHECK_ERROR(GL_INVALID_OPERATION, "BindBuffersBase with invalid buffer id, target: " << target_name);

			gl.bindBuffersRange(target, first, count, t_buffer_ids, offsets, sizes);
			CHECK_ERROR(GL_INVALID_OPERATION, "BindBuffersRange with invalid buffer id, target: " << target_name);
		}

		/* - INVALID_VALUE if any value in <offsets> is less than zero; */
		{
			GLintptr t_offsets[n_buffers];
			GLintptr t_sizes[n_buffers];

			memcpy(t_offsets, offsets, sizeof(offsets));
			memcpy(t_sizes, sizes, sizeof(sizes));

			/* Invalidate the entry */
			t_offsets[validated_index] = -1;
			t_sizes[validated_index]   = -1;

			/* Test */
			gl.bindBuffersRange(target, first, count, buffer_ids, t_offsets, sizes);
			CHECK_ERROR(GL_INVALID_VALUE, "BindBuffersRange with negative offset, target: " << target_name);

			/* Test */
			gl.bindBuffersRange(target, first, count, buffer_ids, offsets, t_sizes);
			CHECK_ERROR(GL_INVALID_VALUE, "BindBuffersRange with negative size, target: " << target_name);
		}

		/* - INVALID_VALUE if any pair of <offsets> and <sizes> exceeds limits. */
		{
			GLintptr t_offsets[n_buffers];
			GLintptr t_sizes[n_buffers];

			memcpy(t_offsets, offsets, sizeof(offsets));
			memcpy(t_sizes, sizes, sizeof(sizes));

			/* Invalidate the entry */
			t_offsets[validated_index] -= 1;	 /* Not aligned by required value */
			t_sizes[validated_index] = size - 1; /* Not aligned by required value */

			/* Test */
			gl.bindBuffersRange(target, first, count, buffer_ids, t_offsets, sizes);
			CHECK_ERROR(GL_INVALID_VALUE, "BindBuffersRange with invalid <offset>, target: " << target_name);

			/* Test */
			if (GL_TRANSFORM_FEEDBACK_BUFFER == target)
			{
				gl.bindBuffersRange(target, first, count, buffer_ids, offsets, t_sizes);
				CHECK_ERROR(GL_INVALID_VALUE, "BindBuffersRange with invalid <size>, target: " << target_name);
			}
		}
	}

	/* Set result */
	m_context.getTestContext().setTestResult(QP_TEST_RESULT_PASS, "Pass");

	/* Done */
	return tcu::TestNode::STOP;
}